

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

void __thiscall
boost::random::
well_engine<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,boost::random::detail::M3<-21>,boost::random::detail::M3<6>,boost::random::detail::M0,boost::random::detail::M3<-13>,boost::random::detail::M3<13>,boost::random::detail::M2<-10>,boost::random::detail::M2<-5>,boost::random::detail::M3<13>,boost::random::detail::no_tempering>
::seed<unsigned_int*>
          (well_engine<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,boost::random::detail::M3<_21>,boost::random::detail::M3<6>,boost::random::detail::M0,boost::random::detail::M3<_13>,boost::random::detail::M3<13>,boost::random::detail::M2<_10>,boost::random::detail::M2<_5>,boost::random::detail::M3<13>,boost::random::detail::no_tempering>
           *this,uint **first,uint *last)

{
  long lVar1;
  
  detail::fill_array_int_impl<32,17ul,unsigned_int*,unsigned_int>(first,last,(uint (*) [17])this);
  *(undefined8 *)(this + 0x48) = 0x11;
  if (*(uint *)this < 0x800000) {
    lVar1 = 1;
    do {
      if (*(int *)(this + lVar1 * 4) != 0) {
        return;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x11);
    *(undefined4 *)this = 0x80000000;
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        detail::fill_array_int<w>(first, last, state_);
        index_ = state_size;

        // fix up the state if it's all zeros.
        if ((state_[0] & (~static_cast<UIntType>(0) << mask_bits)) == 0) {
            for (std::size_t j = 1; j < state_size; ++j) {
                if (state_[j] != 0)
                    return;
            }

            state_[0] = static_cast<UIntType>(1) << (w - 1);
        }
    }